

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O3

void __thiscall IteratorTest::accessIteratorOperations<false>(IteratorTest *this)

{
  undefined8 uVar1;
  pointer puVar2;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var3;
  Iterator<int,_false,_std::allocator<unsigned_long>_> *pIVar4;
  Iterator<int,_true,_std::allocator<unsigned_long>_> *pIVar5;
  reference piVar6;
  reference piVar7;
  logic_error *plVar8;
  code *pcVar9;
  undefined *puVar10;
  long lVar11;
  size_t sVar12;
  long lVar13;
  long lVar14;
  Iterator<TestType,_false,_std::allocator<unsigned_long>_> it_1;
  Iterator<int,_false,_std::allocator<unsigned_long>_> it;
  View<int,_false,_std::allocator<unsigned_long>_> v;
  undefined1 local_188 [24];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_170;
  undefined1 local_158 [8];
  pointer pTStack_150;
  undefined1 local_148 [8];
  undefined1 auStack_140 [16];
  pointer puStack_130;
  Iterator<TestType,_false,_std::allocator<unsigned_long>_> local_118;
  undefined1 local_e8 [8];
  long local_e0;
  size_t *local_d8;
  size_t local_c0;
  size_t local_b8;
  
  _Var3._M_current = (unsigned_long *)operator_new(8);
  *_Var3._M_current = 0x18;
  local_e8 = (undefined1  [8])this;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)&local_e0,_Var3,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var3._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)local_158);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e8);
  stack0xfffffffffffffec8 = (undefined1  [16])0x0;
  _local_148 = (undefined1  [16])0x0;
  _local_158 = (undefined1  [16])0x0;
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_158);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e8);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_188,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_e8,0);
  local_148 = (undefined1  [8])local_188._16_8_;
  pTStack_150 = (pointer)local_188._8_8_;
  local_158 = (undefined1  [8])local_188._0_8_;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_148 + 8),&local_170);
  if (local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_170.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_170.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  lVar11 = 0;
  do {
    if ((local_158 == (undefined1  [8])0x0) ||
       ((size_t *)((geometry_type *)((long)local_158 + 8))->size_ <= (ulong)local_148)) {
      plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
      pcVar9 = std::runtime_error::~runtime_error;
      puVar10 = &std::runtime_error::typeinfo;
LAB_001c13e9:
      __cxa_throw(plVar8,puVar10,pcVar9);
    }
    if (*(int *)pTStack_150 != this->data_[lVar11]) {
      plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar8,"test failed.");
      pcVar9 = std::logic_error::~logic_error;
      puVar10 = &std::logic_error::typeinfo;
      goto LAB_001c13e9;
    }
    andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator++
              ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_158);
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0x18);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e8);
  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
            ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_188,
             (View<int,_false,_std::allocator<unsigned_long>_> *)local_e8,local_b8);
  if (local_158 == (undefined1  [8])0x0) {
    plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
  }
  else {
    if ((undefined1  [8])local_188._0_8_ == local_158) {
      if (local_148 != (undefined1  [8])local_188._16_8_) {
        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar8,"test failed.");
        pcVar9 = std::logic_error::~logic_error;
        puVar10 = &std::logic_error::typeinfo;
        goto LAB_001c1772;
      }
      if (local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_170.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_170.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      pIVar4 = andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::operator--
                         ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_158);
      if ((pIVar4->view_ == (view_pointer)0x0) ||
         ((pIVar4->view_->geometry_).size_ <= pIVar4->index_)) {
        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
        pcVar9 = std::runtime_error::~runtime_error;
        puVar10 = &std::runtime_error::typeinfo;
LAB_001c17a4:
        __cxa_throw(plVar8,puVar10,pcVar9);
      }
      if (*pIVar4->pointer_ != 0x2e) {
        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar8,"test failed.");
        pcVar9 = std::logic_error::~logic_error;
        puVar10 = &std::logic_error::typeinfo;
        goto LAB_001c17a4;
      }
      if ((pointer)auStack_140._0_8_ != (pointer)0x0) {
        operator_delete((void *)auStack_140._0_8_,(long)puStack_130 - auStack_140._0_8_);
      }
      operator_delete(local_d8,local_c0 * 0x18);
      operator_delete(_Var3._M_current,8);
      _Var3._M_current = (unsigned_long *)operator_new(8);
      *_Var3._M_current = 0x18;
      local_e8 = (undefined1  [8])this;
      andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
      Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((Geometry<std::allocator<unsigned_long>> *)&local_e0,_Var3,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )(_Var3._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
                 (allocator_type *)local_158);
      andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                ((View<int,_true,_std::allocator<unsigned_long>_> *)local_e8);
      stack0xfffffffffffffec8 = (undefined1  [16])0x0;
      _local_148 = (undefined1  [16])0x0;
      _local_158 = (undefined1  [16])0x0;
      andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_158);
      andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                ((View<int,_true,_std::allocator<unsigned_long>_> *)local_e8);
      andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_188,
                 (View<int,_true,_std::allocator<unsigned_long>_> *)local_e8,0);
      uVar1 = auStack_140._0_8_;
      pTStack_150 = (pointer)local_188._8_8_;
      local_158 = (undefined1  [8])local_188._0_8_;
      puVar2 = puStack_130;
      auStack_140._0_8_ =
           local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_148 = (undefined1  [8])local_188._16_8_;
      puStack_130 = local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
      auStack_140._8_8_ =
           local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if ((pointer)uVar1 != (pointer)0x0) {
        operator_delete((void *)uVar1,(long)puVar2 - uVar1);
        if (local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_170.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_170.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_170.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      lVar11 = 0;
      do {
        if ((local_158 == (undefined1  [8])0x0) ||
           ((size_t *)((geometry_type *)((long)local_158 + 8))->size_ <= (ulong)local_148)) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
          pcVar9 = std::runtime_error::~runtime_error;
          puVar10 = &std::runtime_error::typeinfo;
LAB_001c141b:
          __cxa_throw(plVar8,puVar10,pcVar9);
        }
        if (*(int *)pTStack_150 != this->data_[lVar11]) {
          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar8,"test failed.");
          pcVar9 = std::logic_error::~logic_error;
          puVar10 = &std::logic_error::typeinfo;
          goto LAB_001c141b;
        }
        andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
                  ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_158);
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x18);
      andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                ((View<int,_true,_std::allocator<unsigned_long>_> *)local_e8);
      andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_188,
                 (View<int,_true,_std::allocator<unsigned_long>_> *)local_e8,local_b8);
      if (local_158 == (undefined1  [8])0x0) {
        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
      }
      else {
        if ((undefined1  [8])local_188._0_8_ == local_158) {
          if (local_148 != (undefined1  [8])local_188._16_8_) {
            plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(plVar8,"test failed.");
            pcVar9 = std::logic_error::~logic_error;
            puVar10 = &std::logic_error::typeinfo;
            goto LAB_001c1820;
          }
          if (local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_170.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_170.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_170.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          pIVar5 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                             ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_158);
          if ((pIVar5->view_ == (view_pointer)0x0) ||
             ((pIVar5->view_->geometry_).size_ <= pIVar5->index_)) {
            plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
            pcVar9 = std::runtime_error::~runtime_error;
            puVar10 = &std::runtime_error::typeinfo;
LAB_001c1852:
            __cxa_throw(plVar8,puVar10,pcVar9);
          }
          if (*pIVar5->pointer_ != 0x2e) {
            plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(plVar8,"test failed.");
            pcVar9 = std::logic_error::~logic_error;
            puVar10 = &std::logic_error::typeinfo;
            goto LAB_001c1852;
          }
          if ((pointer)auStack_140._0_8_ != (pointer)0x0) {
            operator_delete((void *)auStack_140._0_8_,(long)puStack_130 - auStack_140._0_8_);
          }
          operator_delete(local_d8,local_c0 * 0x18);
          operator_delete(_Var3._M_current,8);
          _Var3._M_current = (unsigned_long *)operator_new(8);
          *_Var3._M_current = 0x18;
          local_e8 = (undefined1  [8])this;
          andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
          Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    ((Geometry<std::allocator<unsigned_long>> *)&local_e0,_Var3,
                     (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )(_Var3._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
                     (allocator_type *)local_158);
          andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e8);
          stack0xfffffffffffffec8 = (undefined1  [16])0x0;
          _local_148 = (undefined1  [16])0x0;
          _local_158 = (undefined1  [16])0x0;
          andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                    ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_158);
          andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e8);
          andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
                    ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)&local_118,
                     (View<int,_false,_std::allocator<unsigned_long>_> *)local_e8,0);
          local_188._0_8_ = local_118.view_;
          local_188._8_8_ = local_118.pointer_;
          local_188._16_8_ = local_118.index_;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    (&local_170,&local_118.coordinates_);
          andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                    ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_188);
          uVar1 = auStack_140._0_8_;
          pTStack_150 = (pointer)local_188._8_8_;
          local_158 = (undefined1  [8])local_188._0_8_;
          puVar2 = puStack_130;
          auStack_140._0_8_ =
               local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_148 = (undefined1  [8])local_188._16_8_;
          puStack_130 = local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage;
          auStack_140._8_8_ =
               local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if ((pointer)uVar1 != (pointer)0x0) {
            operator_delete((void *)uVar1,(long)puVar2 - uVar1);
            if (local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_170.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_170.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_170.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
          }
          if (local_118.coordinates_.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_118.coordinates_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_118.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_118.coordinates_.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          lVar11 = 0;
          do {
            if ((local_158 == (undefined1  [8])0x0) ||
               ((size_t *)((geometry_type *)((long)local_158 + 8))->size_ <= (ulong)local_148)) {
              plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
              pcVar9 = std::runtime_error::~runtime_error;
              puVar10 = &std::runtime_error::typeinfo;
LAB_001c144d:
              __cxa_throw(plVar8,puVar10,pcVar9);
            }
            if (*(int *)pTStack_150 != this->data_[lVar11]) {
              plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
              std::logic_error::logic_error(plVar8,"test failed.");
              pcVar9 = std::logic_error::~logic_error;
              puVar10 = &std::logic_error::typeinfo;
              goto LAB_001c144d;
            }
            andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator++
                      ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_158);
            lVar11 = lVar11 + 1;
          } while (lVar11 != 0x18);
          andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e8);
          andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
                    ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_188,
                     (View<int,_false,_std::allocator<unsigned_long>_> *)local_e8,local_b8);
          if (local_158 == (undefined1  [8])0x0) {
            plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
          }
          else {
            if ((undefined1  [8])local_188._0_8_ == local_158) {
              if (local_148 != (undefined1  [8])local_188._16_8_) {
                plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                std::logic_error::logic_error(plVar8,"test failed.");
                pcVar9 = std::logic_error::~logic_error;
                puVar10 = &std::logic_error::typeinfo;
                goto LAB_001c18ce;
              }
              if (local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_170.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_170.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_170.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              pIVar5 = andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::operator--
                                 ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_158);
              if ((pIVar5->view_ == (view_pointer)0x0) ||
                 ((pIVar5->view_->geometry_).size_ <= pIVar5->index_)) {
                plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
                pcVar9 = std::runtime_error::~runtime_error;
                puVar10 = &std::runtime_error::typeinfo;
LAB_001c1900:
                __cxa_throw(plVar8,puVar10,pcVar9);
              }
              if (*pIVar5->pointer_ != 0x2e) {
                plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                std::logic_error::logic_error(plVar8,"test failed.");
                pcVar9 = std::logic_error::~logic_error;
                puVar10 = &std::logic_error::typeinfo;
                goto LAB_001c1900;
              }
              if ((pointer)auStack_140._0_8_ != (pointer)0x0) {
                operator_delete((void *)auStack_140._0_8_,(long)puStack_130 - auStack_140._0_8_);
              }
              operator_delete(local_d8,local_c0 * 0x18);
              operator_delete(_Var3._M_current,8);
              lVar13 = 0;
              lVar14 = 1;
              lVar11 = 0;
              do {
                *(long *)(local_e8 + lVar11 * 8) = lVar13;
                (&local_e0)[lVar11] = lVar14;
                lVar11 = lVar11 + 2;
                lVar13 = lVar13 + 2;
                lVar14 = lVar14 + 2;
              } while (lVar11 != 0x18);
              _Var3._M_current = (unsigned_long *)operator_new(8);
              *_Var3._M_current = 0x18;
              local_158 = (undefined1  [8])local_e8;
              andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
              Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        ((Geometry<std::allocator<unsigned_long>> *)(local_158 + 8),_Var3,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )(_Var3._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
                         (allocator_type *)local_188);
              andres::View<TestType,_false,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<TestType,_false,_std::allocator<unsigned_long>_> *)local_158);
              andres::View<TestType,_false,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<TestType,_false,_std::allocator<unsigned_long>_> *)local_158);
              andres::Iterator<TestType,_false,_std::allocator<unsigned_long>_>::Iterator
                        ((Iterator<TestType,_false,_std::allocator<unsigned_long>_> *)local_188,
                         (View<TestType,_false,_std::allocator<unsigned_long>_> *)local_158,0);
              sVar12 = 0;
              do {
                if (((view_pointer)local_188._0_8_ == (view_pointer)0x0) ||
                   ((size_t *)((geometry_type *)(local_188._0_8_ + 8))->size_ <=
                    (ulong)local_188._16_8_)) {
                  plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
                  pcVar9 = std::runtime_error::~runtime_error;
                  puVar10 = &std::runtime_error::typeinfo;
LAB_001c147f:
                  __cxa_throw(plVar8,puVar10,pcVar9);
                }
                if (sVar12 != *(size_t *)local_188._8_8_) {
                  plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::logic_error::logic_error(plVar8,"test failed.");
                  pcVar9 = std::logic_error::~logic_error;
                  puVar10 = &std::logic_error::typeinfo;
                  goto LAB_001c147f;
                }
                andres::Iterator<TestType,_false,_std::allocator<unsigned_long>_>::operator++
                          ((Iterator<TestType,_false,_std::allocator<unsigned_long>_> *)local_188);
                sVar12 = sVar12 + 1;
              } while (sVar12 != 0x18);
              if (local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_170.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_170.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_170.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              operator_delete((void *)local_148,(long)puStack_130 * 0x18);
              operator_delete(_Var3._M_current,8);
              lVar13 = 0;
              lVar14 = 1;
              lVar11 = 0;
              do {
                *(long *)(local_e8 + lVar11 * 8) = lVar13;
                (&local_e0)[lVar11] = lVar14;
                lVar11 = lVar11 + 2;
                lVar13 = lVar13 + 2;
                lVar14 = lVar14 + 2;
              } while (lVar11 != 0x18);
              _Var3._M_current = (unsigned_long *)operator_new(8);
              *_Var3._M_current = 0x18;
              andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
              Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        ((Geometry<std::allocator<unsigned_long>> *)(local_158 + 8),_Var3,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )(_Var3._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
                         (allocator_type *)local_188);
              andres::View<TestType,_true,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<TestType,_true,_std::allocator<unsigned_long>_> *)local_158);
              andres::View<TestType,_true,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<TestType,_true,_std::allocator<unsigned_long>_> *)local_158);
              andres::Iterator<TestType,_true,_std::allocator<unsigned_long>_>::Iterator
                        ((Iterator<TestType,_true,_std::allocator<unsigned_long>_> *)local_188,
                         (View<TestType,_true,_std::allocator<unsigned_long>_> *)local_158,0);
              sVar12 = 0;
              do {
                if (((view_pointer)local_188._0_8_ == (view_pointer)0x0) ||
                   ((size_t *)((geometry_type *)(local_188._0_8_ + 8))->size_ <=
                    (ulong)local_188._16_8_)) {
                  plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
                  pcVar9 = std::runtime_error::~runtime_error;
                  puVar10 = &std::runtime_error::typeinfo;
LAB_001c14b1:
                  __cxa_throw(plVar8,puVar10,pcVar9);
                }
                if (sVar12 != *(size_t *)local_188._8_8_) {
                  plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::logic_error::logic_error(plVar8,"test failed.");
                  pcVar9 = std::logic_error::~logic_error;
                  puVar10 = &std::logic_error::typeinfo;
                  goto LAB_001c14b1;
                }
                andres::Iterator<TestType,_true,_std::allocator<unsigned_long>_>::operator++
                          ((Iterator<TestType,_true,_std::allocator<unsigned_long>_> *)local_188);
                sVar12 = sVar12 + 1;
              } while (sVar12 != 0x18);
              if (local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_170.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_170.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_170.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              operator_delete((void *)local_148,(long)puStack_130 * 0x18);
              operator_delete(_Var3._M_current,8);
              lVar13 = 0;
              lVar14 = 1;
              lVar11 = 0;
              do {
                *(long *)(local_e8 + lVar11 * 8) = lVar13;
                (&local_e0)[lVar11] = lVar14;
                lVar11 = lVar11 + 2;
                lVar13 = lVar13 + 2;
                lVar14 = lVar14 + 2;
              } while (lVar11 != 0x18);
              _Var3._M_current = (unsigned_long *)operator_new(8);
              *_Var3._M_current = 0x18;
              andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
              Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        ((Geometry<std::allocator<unsigned_long>> *)(local_158 + 8),_Var3,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )(_Var3._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
                         (allocator_type *)local_188);
              andres::View<TestType,_false,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<TestType,_false,_std::allocator<unsigned_long>_> *)local_158);
              andres::View<TestType,_false,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<TestType,_false,_std::allocator<unsigned_long>_> *)local_158);
              andres::Iterator<TestType,_false,_std::allocator<unsigned_long>_>::Iterator
                        (&local_118,
                         (View<TestType,_false,_std::allocator<unsigned_long>_> *)local_158,0);
              local_188._0_8_ = local_118.view_;
              local_188._8_8_ = local_118.pointer_;
              local_188._16_8_ = local_118.index_;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        (&local_170,&local_118.coordinates_);
              andres::Iterator<TestType,_true,_std::allocator<unsigned_long>_>::testInvariant
                        ((Iterator<TestType,_true,_std::allocator<unsigned_long>_> *)local_188);
              if (local_118.coordinates_.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_118.coordinates_.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_118.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_118.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              sVar12 = 0;
              do {
                if (((view_pointer)local_188._0_8_ == (view_pointer)0x0) ||
                   ((size_t *)((geometry_type *)(local_188._0_8_ + 8))->size_ <=
                    (ulong)local_188._16_8_)) {
                  plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
                  pcVar9 = std::runtime_error::~runtime_error;
                  puVar10 = &std::runtime_error::typeinfo;
LAB_001c14e3:
                  __cxa_throw(plVar8,puVar10,pcVar9);
                }
                if (sVar12 != *(size_t *)local_188._8_8_) {
                  plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::logic_error::logic_error(plVar8,"test failed.");
                  pcVar9 = std::logic_error::~logic_error;
                  puVar10 = &std::logic_error::typeinfo;
                  goto LAB_001c14e3;
                }
                andres::Iterator<TestType,_true,_std::allocator<unsigned_long>_>::operator++
                          ((Iterator<TestType,_true,_std::allocator<unsigned_long>_> *)local_188);
                sVar12 = sVar12 + 1;
              } while (sVar12 != 0x18);
              if (local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_170.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_170.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_170.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              operator_delete((void *)local_148,(long)puStack_130 * 0x18);
              operator_delete(_Var3._M_current,8);
              _Var3._M_current = (unsigned_long *)operator_new(8);
              *_Var3._M_current = 0x18;
              local_e8 = (undefined1  [8])this;
              andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
              Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        ((Geometry<std::allocator<unsigned_long>> *)&local_e0,_Var3,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )(_Var3._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
                         (allocator_type *)local_158);
              andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e8);
              stack0xfffffffffffffec8 = (undefined1  [16])0x0;
              _local_148 = (undefined1  [16])0x0;
              _local_158 = (undefined1  [16])0x0;
              andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                        ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_158);
              andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e8);
              andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
                        ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_188,
                         (View<int,_false,_std::allocator<unsigned_long>_> *)local_e8,0);
              local_148 = (undefined1  [8])local_188._16_8_;
              pTStack_150 = (pointer)local_188._8_8_;
              local_158 = (undefined1  [8])local_188._0_8_;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_148 + 8),
                         &local_170);
              if (local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_170.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_170.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_170.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              lVar11 = 0;
              do {
                if ((local_158 == (undefined1  [8])0x0) ||
                   (((geometry_type *)((long)local_158 + 8))->size_ <=
                    (ulong)((long)local_148 + lVar11))) {
                  plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
                  pcVar9 = std::runtime_error::~runtime_error;
                  puVar10 = &std::runtime_error::typeinfo;
LAB_001c1515:
                  __cxa_throw(plVar8,puVar10,pcVar9);
                }
                piVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                                   ((View<int,_false,_std::allocator<unsigned_long>_> *)local_158,
                                    (long)local_148 + lVar11);
                if (*piVar6 != this->data_[lVar11]) {
                  plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::logic_error::logic_error(plVar8,"test failed.");
                  pcVar9 = std::logic_error::~logic_error;
                  puVar10 = &std::logic_error::typeinfo;
                  goto LAB_001c1515;
                }
                lVar11 = lVar11 + 1;
              } while (lVar11 != 0x18);
              andres::View<int,_false,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_e8);
              andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::Iterator
                        ((Iterator<int,_false,_std::allocator<unsigned_long>_> *)local_188,
                         (View<int,_false,_std::allocator<unsigned_long>_> *)local_e8,0);
              if (local_158 == (undefined1  [8])0x0) {
                plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
              }
              else {
                if ((undefined1  [8])local_188._0_8_ == local_158) {
                  if (local_148 == (undefined1  [8])local_188._16_8_) {
                    if (((geometry_type *)((long)local_158 + 8))->size_ <= (long)local_148 + 4U) {
                      plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.")
                      ;
                      goto LAB_001c1960;
                    }
                    piVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                                       ((View<int,_false,_std::allocator<unsigned_long>_> *)
                                        local_158,(long)local_148 + 4U);
                    if (*piVar6 == this->data_[4]) {
                      if ((local_158 == (undefined1  [8])0x0) ||
                         ((size_t *)((geometry_type *)((long)local_158 + 8))->size_ <=
                          (size_t *)((long)local_148 + 0x10))) {
                        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                        std::runtime_error::runtime_error
                                  ((runtime_error *)plVar8,"Assertion failed.");
                        goto LAB_001c1960;
                      }
                      piVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::operator()
                                         ((View<int,_false,_std::allocator<unsigned_long>_> *)
                                          local_158,(size_t)((long)local_148 + 0x10));
                      if (*piVar6 == this->data_[0x10]) {
                        if (local_170.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                          operator_delete(local_170.
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start,
                                          (long)local_170.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                          (long)local_170.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_start);
                        }
                        if ((pointer)auStack_140._0_8_ != (pointer)0x0) {
                          operator_delete((void *)auStack_140._0_8_,
                                          (long)puStack_130 - auStack_140._0_8_);
                        }
                        operator_delete(local_d8,local_c0 * 0x18);
                        operator_delete(_Var3._M_current,8);
                        _Var3._M_current = (unsigned_long *)operator_new(8);
                        *_Var3._M_current = 0x18;
                        local_e8 = (undefined1  [8])this;
                        andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                        Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                  ((Geometry<std::allocator<unsigned_long>> *)&local_e0,_Var3,
                                   (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                    )(_Var3._M_current + 1),&andres::defaultOrder,
                                   &andres::defaultOrder,(allocator_type *)local_158);
                        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_e8);
                        stack0xfffffffffffffec8 = (undefined1  [16])0x0;
                        _local_148 = (undefined1  [16])0x0;
                        _local_158 = (undefined1  [16])0x0;
                        andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                  ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_158)
                        ;
                        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_e8);
                        andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                                  ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_188,
                                   (View<int,_true,_std::allocator<unsigned_long>_> *)local_e8,0);
                        uVar1 = auStack_140._0_8_;
                        pTStack_150 = (pointer)local_188._8_8_;
                        local_158 = (undefined1  [8])local_188._0_8_;
                        puVar2 = puStack_130;
                        auStack_140._0_8_ =
                             local_170.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start;
                        local_148 = (undefined1  [8])local_188._16_8_;
                        puStack_130 = local_170.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
                        auStack_140._8_8_ =
                             local_170.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish;
                        local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                        local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                        local_170.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                        if ((pointer)uVar1 != (pointer)0x0) {
                          operator_delete((void *)uVar1,(long)puVar2 - uVar1);
                          if (local_170.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            operator_delete(local_170.
                                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_170.
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_170.
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          }
                        }
                        lVar11 = 0;
                        do {
                          if ((local_158 == (undefined1  [8])0x0) ||
                             (((geometry_type *)((long)local_158 + 8))->size_ <=
                              (ulong)((long)local_148 + lVar11))) {
                            plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                            std::runtime_error::runtime_error
                                      ((runtime_error *)plVar8,"Assertion failed.");
                            pcVar9 = std::runtime_error::~runtime_error;
                            puVar10 = &std::runtime_error::typeinfo;
LAB_001c1547:
                            __cxa_throw(plVar8,puVar10,pcVar9);
                          }
                          piVar7 = andres::View<int,_true,_std::allocator<unsigned_long>_>::
                                   operator()((View<int,_true,_std::allocator<unsigned_long>_> *)
                                              local_158,(long)local_148 + lVar11);
                          if (*piVar7 != this->data_[lVar11]) {
                            plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                            std::logic_error::logic_error(plVar8,"test failed.");
                            pcVar9 = std::logic_error::~logic_error;
                            puVar10 = &std::logic_error::typeinfo;
                            goto LAB_001c1547;
                          }
                          lVar11 = lVar11 + 1;
                        } while (lVar11 != 0x18);
                        andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                  ((View<int,_true,_std::allocator<unsigned_long>_> *)local_e8);
                        andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::Iterator
                                  ((Iterator<int,_true,_std::allocator<unsigned_long>_> *)local_188,
                                   (View<int,_true,_std::allocator<unsigned_long>_> *)local_e8,0);
                        if (local_158 == (undefined1  [8])0x0) {
                          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error
                                    ((runtime_error *)plVar8,"Assertion failed.");
                        }
                        else {
                          if ((undefined1  [8])local_188._0_8_ == local_158) {
                            if (local_148 == (undefined1  [8])local_188._16_8_) {
                              if (((geometry_type *)((long)local_158 + 8))->size_ <=
                                  (long)local_148 + 4U) {
                                plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                std::runtime_error::runtime_error
                                          ((runtime_error *)plVar8,"Assertion failed.");
                                goto LAB_001c19ce;
                              }
                              piVar7 = andres::View<int,_true,_std::allocator<unsigned_long>_>::
                                       operator()((View<int,_true,_std::allocator<unsigned_long>_> *
                                                  )local_158,(long)local_148 + 4U);
                              if (*piVar7 == this->data_[4]) {
                                if ((local_158 == (undefined1  [8])0x0) ||
                                   ((size_t *)((geometry_type *)((long)local_158 + 8))->size_ <=
                                    (size_t *)((long)local_148 + 0x10))) {
                                  plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                  std::runtime_error::runtime_error
                                            ((runtime_error *)plVar8,"Assertion failed.");
                                  goto LAB_001c19ce;
                                }
                                piVar7 = andres::View<int,_true,_std::allocator<unsigned_long>_>::
                                         operator()((View<int,_true,_std::allocator<unsigned_long>_>
                                                     *)local_158,(size_t)((long)local_148 + 0x10));
                                if (*piVar7 == this->data_[0x10]) {
                                  if (local_170.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                    operator_delete(local_170.
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_170.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_170.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                  }
                                  if ((pointer)auStack_140._0_8_ != (pointer)0x0) {
                                    operator_delete((void *)auStack_140._0_8_,
                                                    (long)puStack_130 - auStack_140._0_8_);
                                  }
                                  operator_delete(local_d8,local_c0 * 0x18);
                                  operator_delete(_Var3._M_current,8);
                                  _Var3._M_current = (unsigned_long *)operator_new(8);
                                  *_Var3._M_current = 0x18;
                                  local_e8 = (undefined1  [8])this;
                                  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                            ((Geometry<std::allocator<unsigned_long>> *)&local_e0,
                                             _Var3,(
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var3._M_current + 1),&andres::defaultOrder,
                                             &andres::defaultOrder,(allocator_type *)local_158);
                                  andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                  testInvariant((View<int,_false,_std::allocator<unsigned_long>_> *)
                                                local_e8);
                                  stack0xfffffffffffffec8 = (undefined1  [16])0x0;
                                  _local_148 = (undefined1  [16])0x0;
                                  _local_158 = (undefined1  [16])0x0;
                                  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                  testInvariant((Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                 *)local_158);
                                  andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                  testInvariant((View<int,_false,_std::allocator<unsigned_long>_> *)
                                                local_e8);
                                  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::
                                  Iterator((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
                                           &local_118,
                                           (View<int,_false,_std::allocator<unsigned_long>_> *)
                                           local_e8,0);
                                  local_188._0_8_ = local_118.view_;
                                  local_188._8_8_ = local_118.pointer_;
                                  local_188._16_8_ = local_118.index_;
                                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                                            (&local_170,&local_118.coordinates_);
                                  andres::Iterator<int,_true,_std::allocator<unsigned_long>_>::
                                  testInvariant((Iterator<int,_true,_std::allocator<unsigned_long>_>
                                                 *)local_188);
                                  uVar1 = auStack_140._0_8_;
                                  pTStack_150 = (pointer)local_188._8_8_;
                                  local_158 = (undefined1  [8])local_188._0_8_;
                                  puVar2 = puStack_130;
                                  auStack_140._0_8_ =
                                       local_170.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_start;
                                  local_148 = (undefined1  [8])local_188._16_8_;
                                  puStack_130 = local_170.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage;
                                  auStack_140._8_8_ =
                                       local_170.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_finish;
                                  local_170.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                                  local_170.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                                  local_170.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                                  if ((pointer)uVar1 != (pointer)0x0) {
                                    operator_delete((void *)uVar1,(long)puVar2 - uVar1);
                                    if (local_170.
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                      operator_delete(local_170.
                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_170.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_170.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                    }
                                  }
                                  if (local_118.coordinates_.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                                    operator_delete(local_118.coordinates_.
                                                                                                        
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_118.coordinates_.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_118.coordinates_.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                  }
                                  lVar11 = 0;
                                  do {
                                    if ((local_158 == (undefined1  [8])0x0) ||
                                       (((geometry_type *)((long)local_158 + 8))->size_ <=
                                        (ulong)((long)local_148 + lVar11))) {
                                      plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                      std::runtime_error::runtime_error
                                                ((runtime_error *)plVar8,"Assertion failed.");
                                      pcVar9 = std::runtime_error::~runtime_error;
                                      puVar10 = &std::runtime_error::typeinfo;
LAB_001c1579:
                                      __cxa_throw(plVar8,puVar10,pcVar9);
                                    }
                                    piVar7 = andres::View<int,_true,_std::allocator<unsigned_long>_>
                                             ::operator()((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_158,(long)local_148 + lVar11);
                                    if (*piVar7 != this->data_[lVar11]) {
                                      plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                      std::logic_error::logic_error(plVar8,"test failed.");
                                      pcVar9 = std::logic_error::~logic_error;
                                      puVar10 = &std::logic_error::typeinfo;
                                      goto LAB_001c1579;
                                    }
                                    lVar11 = lVar11 + 1;
                                  } while (lVar11 != 0x18);
                                  andres::View<int,_false,_std::allocator<unsigned_long>_>::
                                  testInvariant((View<int,_false,_std::allocator<unsigned_long>_> *)
                                                local_e8);
                                  andres::Iterator<int,_false,_std::allocator<unsigned_long>_>::
                                  Iterator((Iterator<int,_false,_std::allocator<unsigned_long>_> *)
                                           local_188,
                                           (View<int,_false,_std::allocator<unsigned_long>_> *)
                                           local_e8,0);
                                  if (local_158 == (undefined1  [8])0x0) {
                                    plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::runtime_error::runtime_error
                                              ((runtime_error *)plVar8,"Assertion failed.");
                                  }
                                  else {
                                    if ((undefined1  [8])local_188._0_8_ == local_158) {
                                      if (local_148 == (undefined1  [8])local_188._16_8_) {
                                        if (((geometry_type *)((long)local_158 + 8))->size_ <=
                                            (long)local_148 + 4U) {
                                          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                          std::runtime_error::runtime_error
                                                    ((runtime_error *)plVar8,"Assertion failed.");
                                          goto LAB_001c1a3c;
                                        }
                                        piVar7 = andres::
                                                 View<int,_true,_std::allocator<unsigned_long>_>::
                                                 operator()((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_158,(long)local_148 + 4U);
                                        if (*piVar7 == this->data_[4]) {
                                          if ((local_158 == (undefined1  [8])0x0) ||
                                             ((size_t *)
                                              ((geometry_type *)((long)local_158 + 8))->size_ <=
                                              (size_t *)((long)local_148 + 0x10))) {
                                            plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                            std::runtime_error::runtime_error
                                                      ((runtime_error *)plVar8,"Assertion failed.");
                                            goto LAB_001c1a3c;
                                          }
                                          piVar7 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  operator()((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_158,(size_t)((long)local_148 + 0x10));
                                          if (*piVar7 == this->data_[0x10]) {
                                            if (local_170.
                                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                ._M_impl.super__Vector_impl_data._M_start !=
                                                (pointer)0x0) {
                                              operator_delete(local_170.
                                                                                                                            
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start,
                                                  (long)local_170.
                                                                                                                
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  - (long)local_170.
                                                                                                                    
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                                            }
                                            if ((pointer)auStack_140._0_8_ != (pointer)0x0) {
                                              operator_delete((void *)auStack_140._0_8_,
                                                              (long)puStack_130 - auStack_140._0_8_)
                                              ;
                                            }
                                            operator_delete(local_d8,local_c0 * 0x18);
                                            operator_delete(_Var3._M_current,8);
                                            return;
                                          }
                                        }
                                      }
                                      plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                      std::logic_error::logic_error(plVar8,"test failed.");
                                      pcVar9 = std::logic_error::~logic_error;
                                      puVar10 = &std::logic_error::typeinfo;
                                      goto LAB_001c1a4a;
                                    }
                                    plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::runtime_error::runtime_error
                                              ((runtime_error *)plVar8,"Assertion failed.");
                                  }
LAB_001c1a3c:
                                  pcVar9 = std::runtime_error::~runtime_error;
                                  puVar10 = &std::runtime_error::typeinfo;
LAB_001c1a4a:
                                  __cxa_throw(plVar8,puVar10,pcVar9);
                                }
                              }
                            }
                            plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                            std::logic_error::logic_error(plVar8,"test failed.");
                            pcVar9 = std::logic_error::~logic_error;
                            puVar10 = &std::logic_error::typeinfo;
                            goto LAB_001c19dc;
                          }
                          plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error
                                    ((runtime_error *)plVar8,"Assertion failed.");
                        }
LAB_001c19ce:
                        pcVar9 = std::runtime_error::~runtime_error;
                        puVar10 = &std::runtime_error::typeinfo;
LAB_001c19dc:
                        __cxa_throw(plVar8,puVar10,pcVar9);
                      }
                    }
                  }
                  plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::logic_error::logic_error(plVar8,"test failed.");
                  pcVar9 = std::logic_error::~logic_error;
                  puVar10 = &std::logic_error::typeinfo;
                  goto LAB_001c196e;
                }
                plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
              }
LAB_001c1960:
              pcVar9 = std::runtime_error::~runtime_error;
              puVar10 = &std::runtime_error::typeinfo;
LAB_001c196e:
              __cxa_throw(plVar8,puVar10,pcVar9);
            }
            plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
          }
          pcVar9 = std::runtime_error::~runtime_error;
          puVar10 = &std::runtime_error::typeinfo;
LAB_001c18ce:
          __cxa_throw(plVar8,puVar10,pcVar9);
        }
        plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
      }
      pcVar9 = std::runtime_error::~runtime_error;
      puVar10 = &std::runtime_error::typeinfo;
LAB_001c1820:
      __cxa_throw(plVar8,puVar10,pcVar9);
    }
    plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error((runtime_error *)plVar8,"Assertion failed.");
  }
  pcVar9 = std::runtime_error::~runtime_error;
  puVar10 = &std::runtime_error::typeinfo;
LAB_001c1772:
  __cxa_throw(plVar8,puVar10,pcVar9);
}

Assistant:

void IteratorTest::accessIteratorOperations() {
    // operator*
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            ++it;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            ++it;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();
        
        for(int i = 0; i < 24; ++i){
            test(*it == data_[i]);
            ++it;
        }
        test(it == v.end());
        test(*(--it)==46);
    }
    // operator->
    {
        TestType data[24];
        for(std::size_t j=0; j<24; ++j) {
            data[j].data_ = j;
        }
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<TestType, constTarget> v(shape.begin(),
            shape.end(), &data[0]);
        andres::Iterator<TestType, constTarget> it = v.begin();
        for(std::size_t j=0; j<24; ++j) {
            test(it->data_ == j);
            ++it;
        }
    }
    {
        TestType data[24];
        for(std::size_t j=0; j<24; ++j) {
            data[j].data_ = j;
        }
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<TestType, true> v(shape.begin(),
            shape.end(), &data[0]);
        andres::Iterator<TestType, true> it = v.begin();
        for(std::size_t j=0; j<24; ++j) {
            test(it->data_ == j);
            ++it;
        }
    }
    {
        TestType data[24];
        for(std::size_t j=0; j<24; ++j) {
            data[j].data_ = j;
        }
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<TestType, false> v(shape.begin(),
            shape.end(), &data[0]);
        andres::Iterator<TestType, true> it = v.begin();
        for(std::size_t j=0; j<24; ++j) {
            test(it->data_ == j);
            ++it;
        }
    }
    // operator[]
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, constTarget> it;
        it = v.begin();

        for(int i = 0; i < 24; ++i){
            test(it[i] == data_[i]);
        }
        test(it == v.begin() &&
               it[4] == data_[4] &&
               it[16] == data_[16]);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        const andres::View<int, true> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();

        for(int i = 0; i < 24; ++i){
            test(it[i] == data_[i]);
        }
        test(it == v.begin() &&
               it[4] == data_[4] &&
               it[16] == data_[16]);
    }
    {
        std::vector<std::size_t> shape(1);
        shape[0] = 24;
        andres::View<int, false> v(shape.begin(), shape.end(), data_);
        andres::Iterator<int, true> it;
        it = v.begin();

        for(int i = 0; i < 24; ++i){
            test(it[i] == data_[i]);
        }
        test(it == v.begin() &&
               it[4] == data_[4] &&
               it[16] == data_[16]);
    }
}